

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O1

bool DerBase::DecodeSetOrSequenceOf<CertificateList>
               (DerType type,uchar *pIn,size_t cbIn,size_t *cbPrefix,size_t *cbSize,
               vector<CertificateList,_std::allocator<CertificateList>_> *out)

{
  CertificateList *pCVar1;
  CertificateList *pCVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  overflow_error *this;
  CertificateList *this_00;
  pointer puVar7;
  bool bVar8;
  undefined1 local_2d0 [8];
  CertificateList t;
  size_t local_60;
  size_t cbElement;
  vector<CertificateList,_std::allocator<CertificateList>_> *local_50;
  size_t *local_48;
  size_t *local_40;
  bool local_31 [8];
  bool isNull;
  
  local_31[0] = false;
  pCVar1 = *(CertificateList **)out;
  pCVar2 = *(CertificateList **)(out + 8);
  this_00 = pCVar1;
  cbElement = (size_t)pIn;
  local_50 = out;
  local_48 = cbSize;
  local_40 = cbPrefix;
  if (pCVar2 != pCVar1) {
    do {
      CertificateList::~CertificateList(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pCVar2);
    *(CertificateList **)(local_50 + 8) = pCVar1;
  }
  bVar4 = DecodeSequenceOrSet(type,(uchar *)cbElement,cbIn,local_40,local_48,local_31);
  if (bVar4) {
    uVar6 = 2;
    if (local_31[0] == false) {
      puVar7 = (pointer)*local_40;
      t.signatureValue.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = puVar7 + *local_48;
      do {
        local_60 = 0;
        t.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        local_2d0 = (undefined1  [8])&PTR_EncodedSize_00150e28;
        t.tbsCertList.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.super_DerBase.cbData = (size_t)&PTR_EncodedSize_00150e70;
        t.tbsCertList.version.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.tbsCertList.super_DerBase.cbData = (size_t)&PTR_EncodedSize_00151ab8;
        t.tbsCertList.version.value.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        t.tbsCertList.version.super_DerBase.cbData = 0;
        t.tbsCertList.version.value.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        t.tbsCertList.signature.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.tbsCertList.version.value.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)&PTR_EncodedSize_001503b8;
        t.tbsCertList.signature.algorithm.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.tbsCertList.signature.super_DerBase.cbData = (size_t)&PTR_EncodedSize_00151908;
        t.tbsCertList.signature.algorithm.value.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        t.tbsCertList.signature.algorithm.super_DerBase.cbData = 0;
        t.tbsCertList.signature.algorithm.value.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        t.tbsCertList.signature.parameters.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.tbsCertList.signature.algorithm.oidIndex = (size_t)&PTR_EncodedSize_00151828;
        t.tbsCertList.signature.parameters.encodedValue.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        t.tbsCertList.signature.parameters.super_DerBase.cbData = 0;
        t.tbsCertList.signature.parameters.encodedValue.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        t.tbsCertList.issuer.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.tbsCertList.signature.parameters.encodedValue.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)&PTR_EncodedSize_00150298;
        t.tbsCertList.issuer.rdnSequence.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.tbsCertList.issuer.super_DerBase.cbData = (size_t)&PTR_EncodedSize_001502e0;
        t.tbsCertList.issuer.rdnSequence.name.
        super__Vector_base<RelativeDistinguishedName,_std::allocator<RelativeDistinguishedName>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        t.tbsCertList.issuer.rdnSequence.super_DerBase.cbData = 0;
        t.tbsCertList.issuer.rdnSequence.name.
        super__Vector_base<RelativeDistinguishedName,_std::allocator<RelativeDistinguishedName>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        t.tbsCertList.thisUpdate.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.tbsCertList.issuer.rdnSequence.name.
        super__Vector_base<RelativeDistinguishedName,_std::allocator<RelativeDistinguishedName>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&PTR_EncodedSize_00151950;
        t.tbsCertList.thisUpdate.super_DerBase.cbData =
             (size_t)&t.tbsCertList.thisUpdate.value._M_string_length;
        t.tbsCertList.thisUpdate.value._M_dataplus._M_p = (pointer)0x0;
        t.tbsCertList.thisUpdate.value._M_string_length._0_1_ = 0;
        t.tbsCertList.thisUpdate.value.field_2._8_4_ = 0;
        t.tbsCertList.nextUpdate.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.tbsCertList.thisUpdate._48_8_ = &PTR_EncodedSize_00151950;
        t.tbsCertList.nextUpdate.super_DerBase.cbData =
             (size_t)&t.tbsCertList.nextUpdate.value._M_string_length;
        t.tbsCertList.nextUpdate.value._M_dataplus._M_p = (pointer)0x0;
        t.tbsCertList.nextUpdate.value._M_string_length._0_1_ = 0;
        t.tbsCertList.nextUpdate.value.field_2._8_4_ = 0;
        t.tbsCertList.revokedCertificates.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.tbsCertList.nextUpdate._48_8_ = &PTR_EncodedSize_00150370;
        t.tbsCertList.revokedCertificates.entries.
        super__Vector_base<RevocationEntry,_std::allocator<RevocationEntry>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        t.tbsCertList.revokedCertificates.super_DerBase.cbData = 0;
        t.tbsCertList.revokedCertificates.entries.
        super__Vector_base<RevocationEntry,_std::allocator<RevocationEntry>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        t.tbsCertList.crlExtensions.innerType.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.tbsCertList.revokedCertificates.entries.
        super__Vector_base<RevocationEntry,_std::allocator<RevocationEntry>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)&PTR_EncodedSize_00150328;
        t.tbsCertList.crlExtensions.innerType.values.
        super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_1_ = 0;
        t.tbsCertList.crlExtensions.innerType.values.
        super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.super__Vector_impl_data.
        _9_8_ = 0;
        t.tbsCertList.crlExtensions.innerType.super_DerBase.cbData = 0;
        t.tbsCertList.crlExtensions.innerType.values.
        super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.super__Vector_impl_data.
        _M_start._0_1_ = 0;
        t.tbsCertList.crlExtensions.innerType.values.
        super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.super__Vector_impl_data.
        _M_start._1_7_ = 0;
        t.signatureAlgorithm.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.tbsCertList.crlExtensions._40_8_ = &PTR_EncodedSize_001503b8;
        t.signatureAlgorithm.algorithm.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.signatureAlgorithm.super_DerBase.cbData = (size_t)&PTR_EncodedSize_00151908;
        t.signatureAlgorithm.algorithm.value.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        t.signatureAlgorithm.algorithm.super_DerBase.cbData = 0;
        t.signatureAlgorithm.algorithm.value.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        t.signatureAlgorithm.parameters.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.signatureAlgorithm.algorithm.oidIndex = (size_t)&PTR_EncodedSize_00151828;
        t.signatureAlgorithm.parameters.encodedValue.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        t.signatureAlgorithm.parameters.super_DerBase.cbData = 0;
        t.signatureAlgorithm.parameters.encodedValue.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        t.signatureValue.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.signatureAlgorithm.parameters.encodedValue.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)&PTR_EncodedSize_00151a28;
        t.signatureValue.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        t.signatureValue.super_DerBase.cbData = 0;
        t.signatureValue.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        if (t.signatureValue.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage < puVar7) {
          this = (overflow_error *)__cxa_allocate_exception(0x10);
          std::overflow_error::overflow_error(this,"Integer overflow");
          __cxa_throw(this,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
        }
        bVar5 = CertificateList::Decode
                          ((CertificateList *)local_2d0,puVar7 + cbElement,
                           (long)t.signatureValue.value.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar7,
                           &local_60);
        sVar3 = local_60;
        if (bVar5) {
          std::vector<CertificateList,_std::allocator<CertificateList>_>::push_back
                    (local_50,(value_type *)local_2d0);
          puVar7 = puVar7 + sVar3;
          bVar8 = puVar7 == (pointer)(*local_40 + *local_48);
          bVar5 = !bVar8;
          bVar4 = (bool)(bVar8 | bVar4);
        }
        else {
          bVar4 = false;
          if (local_60 == 0) {
            *local_40 = 0;
            *local_48 = 0;
          }
          bVar5 = false;
        }
        CertificateList::~CertificateList((CertificateList *)local_2d0);
      } while (bVar5);
      return bVar4;
    }
  }
  else {
    uVar6 = 0;
  }
  *local_40 = uVar6;
  *local_48 = 0;
  return bVar4;
}

Assistant:

static bool DecodeSetOrSequenceOf(DerType type, const unsigned char* pIn, size_t cbIn, size_t& cbPrefix, size_t& cbSize, std::vector<T>& out)
	{
		bool isNull = false;
		size_t offset = 0;

		out.clear();

		if (!DecodeSequenceOrSet(type, pIn, cbIn, cbPrefix, cbSize, isNull))
		{
			cbPrefix = 0;
			cbSize = 0;
			return false;
		}

		if (isNull)
		{
			cbPrefix = 2;
			cbSize = 0;
			return true;
		}

		offset = cbPrefix;
        cbIn = cbPrefix + cbSize;

		for (;;)
		{
			size_t cbElement = 0;
			T t;

			if (offset > cbIn)
				throw std::overflow_error("Integer overflow");

			if (!t.Decode(pIn + offset, cbIn - offset, cbElement))
			{
				// Accomodate the case where we have to decode into the 
				// sequence to see if the element is optional
				if( cbElement == 0 )
				{
					cbPrefix = 0;
					cbSize = 0;
				}
				return false;
			}

			offset += cbElement;
			out.push_back(t);

			// Exit conditions - should have used all of our
			// incoming data, as long as everything is polite
			if (offset == cbSize + cbPrefix)
			{
				return true;
			}
		}
	}